

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirArchive.cpp
# Opt level: O2

void __thiscall gtar::DirArchive::DirArchive(DirArchive *this,string *filename,OpenMode mode)

{
  string *this_00;
  _Rb_tree_header *p_Var1;
  int iVar2;
  runtime_error *this_01;
  string local_280 [32];
  string local_260;
  string stripped;
  stat dirStat;
  
  (this->super_Archive)._vptr_Archive = (_func_int **)&PTR__DirArchive_001c0d40;
  this_00 = &this->m_filename;
  std::__cxx11::string::string((string *)this_00,(string *)filename);
  this->m_mode = mode;
  p_Var1 = &(this->m_createdDirectories)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->m_createdDirectories)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_createdDirectories)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_createdDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_createdDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_createdDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_createdDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_fileNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fileNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fileNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (mode != Read) {
    iVar2 = stat((filename->_M_dataplus)._M_p,(stat *)&dirStat);
    if (iVar2 == 0) {
      if ((dirStat.st_mode._1_1_ & 0x40) == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&stripped);
        std::operator<<((ostream *)stripped.field_2._M_local_buf,
                        "Error opening directory for write (file already exists)");
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this_01,local_280);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_260,(string *)this_00);
      createDirectory(&local_260);
      std::__cxx11::string::~string((string *)&local_260);
    }
  }
  std::__cxx11::string::find_last_not_of((char)this_00,0x2f);
  std::__cxx11::string::substr((ulong)&stripped,(ulong)this_00);
  searchDirectory(this,&stripped);
  std::__cxx11::string::~string((string *)&stripped);
  return;
}

Assistant:

DirArchive::DirArchive(const string &filename, const OpenMode mode):
        m_filename(filename), m_mode(mode), m_createdDirectories()
    {
        // make sure that the base directory exists
        if(m_mode != Read)
        {
            struct stat dirStat;
            const int result(stat(filename.c_str(), &dirStat));
            if(result == 0) // found that name
            {
                // not a directory
                if(!(dirStat.st_mode & S_IFDIR))
                {
                    stringstream msg;
                    msg << "Error opening directory for write (file already exists)";
                    throw runtime_error(msg.str());
                }
            }
            else
                createDirectory(m_filename);
        }

        // populate the list of found file names. first, strip all
        // trailing slashes; this will never return npos because the
        // directory always has at least one slash
        const size_t stripLength(m_filename.find_last_not_of('/') + 1);
        const string stripped(m_filename.substr(0, stripLength));
        searchDirectory(stripped);
    }